

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Device.cpp
# Opt level: O0

unique_ptr<TRM::Device,_std::default_delete<TRM::Device>_> __thiscall
TRM::Device::CreateBitmapDevice(Device *this,shared_ptr<TRM::Bitmap> *bitmap)

{
  shared_ptr<TRM::Bitmap> local_20;
  shared_ptr<TRM::Bitmap> *bitmap_local;
  
  local_20.super___shared_ptr<TRM::Bitmap,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)bitmap;
  bitmap_local = (shared_ptr<TRM::Bitmap> *)this;
  std::make_unique<TRM::BitmapDevice,std::shared_ptr<TRM::Bitmap>&>(&local_20);
  std::unique_ptr<TRM::Device,std::default_delete<TRM::Device>>::
  unique_ptr<TRM::BitmapDevice,std::default_delete<TRM::BitmapDevice>,void>
            ((unique_ptr<TRM::Device,std::default_delete<TRM::Device>> *)this,
             (unique_ptr<TRM::BitmapDevice,_std::default_delete<TRM::BitmapDevice>_> *)&local_20);
  std::unique_ptr<TRM::BitmapDevice,_std::default_delete<TRM::BitmapDevice>_>::~unique_ptr
            ((unique_ptr<TRM::BitmapDevice,_std::default_delete<TRM::BitmapDevice>_> *)&local_20);
  return (__uniq_ptr_data<TRM::Device,_std::default_delete<TRM::Device>,_true,_true>)
         (__uniq_ptr_data<TRM::Device,_std::default_delete<TRM::Device>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Device> Device::CreateBitmapDevice(
    std::shared_ptr<Bitmap> bitmap) {
  return std::make_unique<BitmapDevice>(bitmap);
}